

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall DPolyDoor::Serialize(DPolyDoor *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  type val;
  podoortype_t local_1c;
  
  DMovePoly::Serialize(&this->super_DMovePoly,arc);
  local_1c = this->m_Type;
  ::Serialize(arc,"type",&local_1c,(uint32_t *)0x0);
  this->m_Type = local_1c;
  pFVar1 = ::Serialize(arc,"direction",&(this->m_Direction).Degrees,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"totaldist",&this->m_TotalDist,(double *)0x0);
  pFVar1 = ::Serialize(pFVar1,"tics",&this->m_Tics,(int32_t *)0x0);
  pFVar1 = ::Serialize(pFVar1,"waittics",&this->m_WaitTics,(int32_t *)0x0);
  ::Serialize(pFVar1,"close",&this->m_Close,(bool *)0x0);
  return;
}

Assistant:

void DPolyDoor::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("direction", m_Direction)
		("totaldist", m_TotalDist)
		("tics", m_Tics)
		("waittics", m_WaitTics)
		("close", m_Close);
}